

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SelectWeapon
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  AActor *this;
  PClassActor *type;
  PClass *pPVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  AWeapon *pAVar5;
  undefined4 extraout_var_00;
  PClass *pPVar6;
  PClassActor *pPVar7;
  char *pcVar8;
  bool bVar9;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_003d2215:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d2215;
  }
  this = (AActor *)(param->field_0).field_1.a;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar2 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar2) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d2215;
    }
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_003d2291:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc15,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0)))) {
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d2291;
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if ((type != (PClassActor *)0x0) &&
     (pPVar7 = type, type != (PClassActor *)AWeapon::RegistrationInfo.MyClass)) {
    do {
      pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
      if (pPVar7 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
    } while (pPVar7 != (PClassActor *)0x0);
    if (pPVar7 == (PClassActor *)0x0) {
      pcVar8 = "cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AWeapon))";
      goto LAB_003d2291;
    }
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d2253;
    }
  }
  else if (param[2].field_0.field_3.Type != '\0') {
    pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003d2253:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc16,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  uVar1 = param[2].field_0.i;
  if (((type == (PClassActor *)0x0) && ((uVar1 & 1) == 0)) || (this->player == (player_t *)0x0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc1c,
                    "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003d215a:
    if (ret->RegType != '\0') goto LAB_003d222d;
    uVar4 = 0;
  }
  else {
    pAVar5 = (AWeapon *)AActor::FindInventory(this,type,false);
    pPVar2 = AWeapon::RegistrationInfo.MyClass;
    if (pAVar5 == (AWeapon *)0x0) {
LAB_003d2168:
      if ((uVar1 & 1) == 0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xc33,
                        "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003d215a;
      }
      APlayerPawn::PickNewWeapon(this->player->mo,(PClassAmmo *)0x0);
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc2f,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if ((pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
          Class == (PClass *)0x0) {
        iVar3 = (**(pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = (PClass *)CONCAT44(extraout_var_00,iVar3);
      }
      pPVar6 = (pAVar5->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.Class;
      bVar9 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar2 && bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar2) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar9) goto LAB_003d2168;
      if (this->player->ReadyWeapon != pAVar5) {
        this->player->PendingWeapon = pAVar5;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc27,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    uVar4 = 1;
    if (ret->RegType != '\0') {
LAB_003d222d:
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
  }
  *(undefined4 *)ret->Location = uVar4;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectWeapon)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(cls, AWeapon);
	PARAM_INT_DEF(flags);

	bool selectPriority = !!(flags & SWF_SELECTPRIORITY);

	if ((!selectPriority && cls == NULL) || self->player == NULL)
	{
		ACTION_RETURN_BOOL(false);
	}

	AWeapon *weaponitem = static_cast<AWeapon*>(self->FindInventory(cls));

	if (weaponitem != NULL && weaponitem->IsKindOf(RUNTIME_CLASS(AWeapon)))
	{
		if (self->player->ReadyWeapon != weaponitem)
		{
			self->player->PendingWeapon = weaponitem;
		}
		ACTION_RETURN_BOOL(true);
	}
	else if (selectPriority)
	{
		// [XA] if the named weapon cannot be found (or is a dummy like 'None'),
		//      select the next highest priority weapon. This is basically
		//      the same as A_CheckReload minus the ammo check. Handy.
		self->player->mo->PickNewWeapon(NULL);
		ACTION_RETURN_BOOL(true);
	}
	else
	{
		ACTION_RETURN_BOOL(false);
	}
}